

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O3

bool __thiscall
deqp::egl::MultiThreadedConfigTest::runThread(MultiThreadedConfigTest *this,TestThread *thread)

{
  pointer ppvVar1;
  MultiThreadedConfigTest *pMVar2;
  uint uVar3;
  int iVar4;
  deUint32 dVar5;
  Library *pLVar6;
  pointer ppvVar7;
  ThreadLog *pTVar8;
  long lVar9;
  ulong uVar10;
  EndMessageToken *pEVar11;
  int iVar12;
  bool bVar13;
  EGLint configCount;
  vector<void_*,_std::allocator<void_*>_> configs;
  EGLint value;
  Random rnd;
  char *local_80;
  vector<void_*,_std::allocator<void_*>_> local_78;
  MultiThreadedConfigTest *local_58;
  int local_4c;
  ThreadLog *local_48;
  deRandom local_40;
  
  pLVar6 = EglTestContext::getLibrary((this->super_MultiThreadedTest).super_TestCase.m_eglTestCtx);
  uVar3 = thread->m_id + 0x28c3;
  uVar3 = (uVar3 >> 0x10 ^ uVar3 ^ 0x3d) * 9;
  uVar3 = (uVar3 >> 4 ^ uVar3) * 0x27d4eb2d;
  deRandom_init(&local_40,uVar3 >> 0xf ^ uVar3);
  local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  MultiThreadedTest::barrier(&this->super_MultiThreadedTest,thread);
  local_58 = this;
  if (0 < this->m_getConfigs) {
    pTVar8 = &thread->m_log;
    iVar12 = 0;
    do {
      pMVar2 = local_58;
      iVar4 = (*pLVar6->_vptr_Library[0x1a])
                        (pLVar6,(local_58->super_MultiThreadedTest).m_display,0,0,&local_80);
      std::ostream::_M_insert<unsigned_long>((ulong)pTVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8," = eglGetConfigs(",0x11)
      ;
      std::ostream::_M_insert<void_const*>(pTVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,", NULL, 0, ",0xb);
      std::ostream::operator<<(pTVar8,(int)local_80);
      pEVar11 = (EndMessageToken *)0x1adddc7;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,")",1);
      ThreadLog::operator<<(pTVar8,pEVar11);
      dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
      eglu::checkError(dVar5,"eglGetConfigs()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x238);
      if (iVar4 == 0) goto LAB_00e1bf41;
      std::vector<void_*,_std::allocator<void_*>_>::resize
                (&local_78,
                 (long)(int)local_80 +
                 ((long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3));
      lVar9 = (long)(int)local_80;
      if (lVar9 != 0) {
        iVar4 = (*pLVar6->_vptr_Library[0x1a])
                          (pLVar6,(pMVar2->super_MultiThreadedTest).m_display,
                           local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_start +
                           (((ulong)((long)local_78.
                                           super__Vector_base<void_*,_std::allocator<void_*>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_78.
                                          super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 3) - lVar9),
                           lVar9,&local_80);
        std::ostream::_M_insert<unsigned_long>((ulong)pTVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pTVar8," = eglGetConfigs(",0x11);
        std::ostream::_M_insert<void_const*>(pTVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,", &configs\' ",0xc);
        std::ostream::operator<<(pTVar8,(int)local_80);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,", ",2);
        std::ostream::operator<<(pTVar8,(int)local_80);
        pEVar11 = (EndMessageToken *)0x1adddc7;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,")",1);
        ThreadLog::operator<<(pTVar8,pEVar11);
        dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
        eglu::checkError(dVar5,"eglGetConfigs()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x247);
        if (iVar4 == 0) goto LAB_00e1bf41;
      }
      uVar10 = (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      if (uVar10 < 0x29) {
        dVar5 = deRandom_getUint32(&local_40);
        ppvVar7 = local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start +
                  (((ulong)((long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) -
                  (long)(int)(dVar5 % ((int)uVar10 - 1U)));
      }
      else {
        ppvVar7 = local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start + 0x28;
      }
      if (ppvVar7 !=
          local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
        ._M_finish = ppvVar7;
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < local_58->m_getConfigs);
  }
  if (0 < local_58->m_chooseConfigs) {
    pTVar8 = &thread->m_log;
    iVar12 = 0;
    do {
      pMVar2 = local_58;
      iVar4 = (*pLVar6->_vptr_Library[2])
                        (pLVar6,(local_58->super_MultiThreadedTest).m_display,runThread::attribList,
                         0,0,&local_80);
      std::ostream::_M_insert<unsigned_long>((ulong)pTVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pTVar8," = eglChooseConfig(",0x13);
      std::ostream::_M_insert<void_const*>(pTVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pTVar8,", { EGL_NONE }, NULL, 0, ",0x19);
      std::ostream::operator<<(pTVar8,(int)local_80);
      pEVar11 = (EndMessageToken *)0x1adddc7;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,")",1);
      ThreadLog::operator<<(pTVar8,pEVar11);
      dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
      eglu::checkError(dVar5,"eglChooseConfig()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x268);
      if (iVar4 == 0) goto LAB_00e1bf41;
      std::vector<void_*,_std::allocator<void_*>_>::resize
                (&local_78,
                 (long)(int)local_80 +
                 ((long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3));
      lVar9 = (long)(int)local_80;
      if (lVar9 != 0) {
        iVar4 = (*pLVar6->_vptr_Library[2])
                          (pLVar6,(pMVar2->super_MultiThreadedTest).m_display,runThread::attribList,
                           local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_start +
                           (((ulong)((long)local_78.
                                           super__Vector_base<void_*,_std::allocator<void_*>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_78.
                                          super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 3) - lVar9),
                           lVar9,&local_80);
        std::ostream::_M_insert<unsigned_long>((ulong)pTVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pTVar8," = eglChooseConfig(",0x13);
        std::ostream::_M_insert<void_const*>(pTVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pTVar8,", { EGL_NONE }, &configs, ",0x1a);
        std::ostream::operator<<(pTVar8,(int)local_80);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,", ",2);
        std::ostream::operator<<(pTVar8,(int)local_80);
        pEVar11 = (EndMessageToken *)0x1adddc7;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,")",1);
        ThreadLog::operator<<(pTVar8,pEVar11);
        dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
        eglu::checkError(dVar5,"eglChooseConfig()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x277);
        if (iVar4 == 0) goto LAB_00e1bf41;
      }
      uVar10 = (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      if (uVar10 < 0x29) {
        dVar5 = deRandom_getUint32(&local_40);
        ppvVar7 = local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start +
                  (((ulong)((long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) -
                  (long)(int)(dVar5 % ((int)uVar10 - 1U)));
      }
      else {
        ppvVar7 = local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start + 0x28;
      }
      if (ppvVar7 !=
          local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
        ._M_finish = ppvVar7;
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < local_58->m_chooseConfigs);
  }
  if (local_58->m_query < 1) {
    bVar13 = true;
  }
  else {
    local_48 = &thread->m_log;
    iVar12 = 0;
    do {
      dVar5 = deRandom_getUint32(&local_40);
      ppvVar1 = local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppvVar7 = local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar3 = runThread::attributes[dVar5 & 0x1f];
      dVar5 = deRandom_getUint32(&local_40);
      iVar4 = (*pLVar6->_vptr_Library[0x19])
                        (pLVar6,(local_58->super_MultiThreadedTest).m_display,
                         local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [(int)((ulong)dVar5 %
                               ((ulong)((long)ppvVar1 - (long)ppvVar7) >> 3 & 0xffffffff))],
                         (ulong)uVar3,&local_4c);
      pTVar8 = local_48;
      std::ostream::_M_insert<unsigned_long>((ulong)local_48);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pTVar8," = eglGetConfigAttrib(",0x16);
      std::ostream::_M_insert<void_const*>(pTVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,", ",2);
      std::ostream::_M_insert<void_const*>(pTVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,", ",2);
      uVar3 = uVar3 - 0x3020;
      local_80 = "<Unknown>";
      if (uVar3 < 0x23) {
        local_80 = &DAT_01b98ea0 + *(int *)(&DAT_01b98ea0 + (ulong)uVar3 * 4);
      }
      pTVar8 = ThreadLog::operator<<(local_48,&local_80);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,", ",2);
      std::ostream::operator<<(pTVar8,local_4c);
      pEVar11 = (EndMessageToken *)0x1adddc7;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar8,")",1);
      ThreadLog::operator<<(pTVar8,pEVar11);
      dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
      eglu::checkError(dVar5,"eglGetConfigAttrib()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x2b9);
      bVar13 = iVar4 != 0;
    } while ((bVar13) && (iVar12 = iVar12 + 1, iVar12 < local_58->m_query));
  }
LAB_00e1bf43:
  if (local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar13;
LAB_00e1bf41:
  bVar13 = false;
  goto LAB_00e1bf43;
}

Assistant:

bool MultiThreadedConfigTest::runThread (TestThread& thread)
{
	const Library&		egl		= getLibrary();
	de::Random			rnd		(deInt32Hash(thread.getId() + 10435));
	vector<EGLConfig>	configs;

	barrier(thread);

	for (int getConfigsNdx = 0; getConfigsNdx < m_getConfigs; getConfigsNdx++)
	{
		EGLint configCount;

		// Get number of configs
		{
			EGLBoolean result;

			result = egl.getConfigs(m_display, NULL, 0, &configCount);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglGetConfigs(" << m_display << ", NULL, 0, " << configCount << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglGetConfigs()");

			if (!result)
				return false;
		}

		configs.resize(configs.size() + configCount);

		// Get configs
		if (configCount != 0)
		{
			EGLBoolean result;

			result = egl.getConfigs(m_display, &(configs[configs.size() - configCount]), configCount, &configCount);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglGetConfigs(" << m_display << ", &configs' " << configCount << ", " << configCount << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglGetConfigs()");

			if (!result)
				return false;
		}

		// Pop configs to stop config list growing
		if (configs.size() > 40)
		{
			configs.erase(configs.begin() + 40, configs.end());
		}
		else
		{
			const int popCount = rnd.getInt(0, (int)(configs.size()-2));

			configs.erase(configs.begin() + (configs.size() - popCount), configs.end());
		}
	}

	for (int chooseConfigsNdx = 0; chooseConfigsNdx < m_chooseConfigs; chooseConfigsNdx++)
	{
		EGLint configCount;

		static const EGLint attribList[] = {
			EGL_NONE
		};

		// Get number of configs
		{
			EGLBoolean result;

			result = egl.chooseConfig(m_display, attribList, NULL, 0, &configCount);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglChooseConfig(" << m_display << ", { EGL_NONE }, NULL, 0, " << configCount << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglChooseConfig()");

			if (!result)
				return false;
		}

		configs.resize(configs.size() + configCount);

		// Get configs
		if (configCount != 0)
		{
			EGLBoolean result;

			result = egl.chooseConfig(m_display, attribList, &(configs[configs.size() - configCount]), configCount, &configCount);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglChooseConfig(" << m_display << ", { EGL_NONE }, &configs, " << configCount << ", " << configCount << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglChooseConfig()");

			if (!result)
				return false;
		}

		// Pop configs to stop config list growing
		if (configs.size() > 40)
		{
			configs.erase(configs.begin() + 40, configs.end());
		}
		else
		{
			const int popCount = rnd.getInt(0, (int)(configs.size()-2));

			configs.erase(configs.begin() + (configs.size() - popCount), configs.end());
		}
	}

	{
		// Perform queries on configs
		static const EGLint attributes[] =
		{
			EGL_BUFFER_SIZE,
			EGL_RED_SIZE,
			EGL_GREEN_SIZE,
			EGL_BLUE_SIZE,
			EGL_LUMINANCE_SIZE,
			EGL_ALPHA_SIZE,
			EGL_ALPHA_MASK_SIZE,
			EGL_BIND_TO_TEXTURE_RGB,
			EGL_BIND_TO_TEXTURE_RGBA,
			EGL_COLOR_BUFFER_TYPE,
			EGL_CONFIG_CAVEAT,
			EGL_CONFIG_ID,
			EGL_CONFORMANT,
			EGL_DEPTH_SIZE,
			EGL_LEVEL,
			EGL_MAX_PBUFFER_WIDTH,
			EGL_MAX_PBUFFER_HEIGHT,
			EGL_MAX_PBUFFER_PIXELS,
			EGL_MAX_SWAP_INTERVAL,
			EGL_MIN_SWAP_INTERVAL,
			EGL_NATIVE_RENDERABLE,
			EGL_NATIVE_VISUAL_ID,
			EGL_NATIVE_VISUAL_TYPE,
			EGL_RENDERABLE_TYPE,
			EGL_SAMPLE_BUFFERS,
			EGL_SAMPLES,
			EGL_STENCIL_SIZE,
			EGL_SURFACE_TYPE,
			EGL_TRANSPARENT_TYPE,
			EGL_TRANSPARENT_RED_VALUE,
			EGL_TRANSPARENT_GREEN_VALUE,
			EGL_TRANSPARENT_BLUE_VALUE
		};

		for (int queryNdx = 0; queryNdx < m_query; queryNdx++)
		{
			const EGLint	attribute	= attributes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(attributes)-1)];
			EGLConfig		config		= configs[rnd.getInt(0, (int)(configs.size()-1))];
			EGLint			value;
			EGLBoolean		result;

			result = egl.getConfigAttrib(m_display, config, attribute, &value);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglGetConfigAttrib(" << m_display << ", " << config << ", " << configAttributeToString(attribute) << ", " << value << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglGetConfigAttrib()");

			if (!result)
				return false;
		}
	}

	return true;
}